

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O0

int __thiscall libtorrent::aux::session_impl::next_port(session_impl *this)

{
  uint uVar1;
  int local_24;
  int port;
  int local_1c;
  pair<int,_int> out_ports;
  int num;
  int start;
  session_impl *this_local;
  
  out_ports.second = session_settings::get_int(&this->m_settings,0x4026);
  out_ports.first = session_settings::get_int(&this->m_settings,0x4027);
  local_24 = out_ports.second + out_ports.first;
  ::std::pair<int,_int>::pair<int_&,_int,_true>((pair<int,_int> *)&port,&out_ports.second,&local_24)
  ;
  if ((this->m_next_port < port) || (local_1c < this->m_next_port)) {
    this->m_next_port = port;
  }
  uVar1 = this->m_next_port;
  this->m_next_port = this->m_next_port + 1;
  if (local_1c < this->m_next_port) {
    this->m_next_port = port;
  }
  session_log(this," *** BINDING OUTGOING CONNECTION [ port: %d ]",(ulong)uVar1);
  return uVar1;
}

Assistant:

int session_impl::next_port() const
	{
		int start = m_settings.get_int(settings_pack::outgoing_port);
		int num = m_settings.get_int(settings_pack::num_outgoing_ports);
		std::pair<int, int> out_ports(start, start + num);
		if (m_next_port < out_ports.first || m_next_port > out_ports.second)
			m_next_port = out_ports.first;

		int port = m_next_port;
		++m_next_port;
		if (m_next_port > out_ports.second) m_next_port = out_ports.first;
#ifndef TORRENT_DISABLE_LOGGING
		session_log(" *** BINDING OUTGOING CONNECTION [ port: %d ]", port);
#endif
		return port;
	}